

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse2_128_8.c
# Opt level: O2

parasail_result_t *
parasail_nw_table_striped_profile_sse2_128_8
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  void *pvVar1;
  parasail_matrix_t *ppVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  char cVar8;
  uint uVar9;
  parasail_result_t *ppVar10;
  __m128i *palVar11;
  __m128i *ptr;
  int8_t *ptr_00;
  __m128i *ptr_01;
  int8_t iVar12;
  int iVar13;
  char *pcVar14;
  char cVar15;
  long lVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  char *__format;
  ulong uVar20;
  long lVar21;
  int8_t *piVar22;
  long lVar23;
  long lVar24;
  ulong size;
  uint uVar25;
  long lVar26;
  undefined4 uVar27;
  undefined1 uVar40;
  undefined1 uVar41;
  undefined1 uVar42;
  undefined1 auVar29 [16];
  undefined4 uVar28;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  __m128i alVar39;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  __m128i alVar46;
  undefined1 auVar47 [16];
  __m128i_8_t A;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  __m128i vH;
  int32_t in_stack_fffffffffffffe98;
  __m128i *local_160;
  char local_c8;
  char cStack_c7;
  char cStack_c6;
  char cStack_c5;
  char local_98;
  char cStack_97;
  char cStack_96;
  char cStack_95;
  __m128i_8_t e;
  __m128i_8_t h;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar14 = "profile";
  }
  else {
    pvVar1 = (profile->profile8).score;
    if (pvVar1 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar14 = "profile->profile8.score";
    }
    else {
      ppVar2 = profile->matrix;
      if (ppVar2 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar14 = "profile->matrix";
      }
      else {
        uVar9 = profile->s1Len;
        if ((int)uVar9 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar14 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar14 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar14 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar14 = "open";
        }
        else {
          if (-1 < gap) {
            uVar19 = uVar9 - 1;
            size = (ulong)uVar9 + 0xf >> 4;
            iVar17 = -open;
            iVar13 = ppVar2->min;
            uVar27 = CONCAT31((int3)((uint)iVar13 >> 8),-(char)iVar13);
            uVar25 = (uint)(byte)-(char)iVar13;
            if (iVar13 != iVar17 && SBORROW4(iVar13,iVar17) == iVar13 + open < 0) {
              uVar25 = open;
            }
            cVar8 = '~' - (char)ppVar2->max;
            ppVar10 = parasail_result_new_table1((uint)((ulong)uVar9 + 0xf) & 0x7ffffff0,s2Len);
            if (ppVar10 != (parasail_result_t *)0x0) {
              ppVar10->flag = ppVar10->flag | 0x10120801;
              palVar11 = parasail_memalign___m128i(0x10,size);
              local_160 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign_int8_t(0x10,(ulong)(s2Len + 1));
              auVar29._0_4_ = -(uint)((int)((ulong)palVar11 >> 0x20) == 0 && (int)palVar11 == 0);
              auVar29._4_4_ = -(uint)((int)local_160 == 0 && (int)((ulong)local_160 >> 0x20) == 0);
              auVar29._8_4_ = -(uint)((int)((ulong)ptr >> 0x20) == 0 && (int)ptr == 0);
              auVar29._12_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
              iVar13 = movmskps(uVar27,auVar29);
              if (iVar13 == 0) {
                iVar13 = s2Len + -1;
                uVar42 = (undefined1)((uint)open >> 0x18);
                uVar41 = (undefined1)((uint)open >> 0x10);
                uVar40 = (undefined1)((uint)open >> 8);
                auVar30._4_4_ =
                     (int)(CONCAT35(CONCAT21(CONCAT11(uVar42,uVar42),uVar41),CONCAT14(uVar41,open))
                          >> 0x20);
                auVar30[3] = uVar40;
                auVar30[2] = uVar40;
                auVar30[0] = (undefined1)open;
                auVar30[1] = auVar30[0];
                auVar30._8_8_ = 0;
                auVar29 = pshuflw(auVar30,auVar30,0);
                uVar27 = auVar29._0_4_;
                uVar42 = (undefined1)((uint)gap >> 0x18);
                uVar41 = (undefined1)((uint)gap >> 0x10);
                uVar40 = (undefined1)((uint)gap >> 8);
                auVar32._4_4_ =
                     (int)(CONCAT35(CONCAT21(CONCAT11(uVar42,uVar42),uVar41),CONCAT14(uVar41,gap))
                          >> 0x20);
                auVar32[3] = uVar40;
                auVar32[2] = uVar40;
                auVar32[0] = (undefined1)gap;
                auVar32[1] = auVar32[0];
                auVar32._8_8_ = 0;
                auVar29 = pshuflw(auVar32,auVar32,0);
                uVar28 = auVar29._0_4_;
                cVar15 = (char)uVar25 + -0x7f;
                auVar29 = ZEXT216(CONCAT11(cVar15,cVar15));
                auVar29 = pshuflw(auVar29,auVar29,0);
                local_c8 = auVar29[0];
                cStack_c7 = auVar29[1];
                cStack_c6 = auVar29[2];
                cStack_c5 = auVar29[3];
                auVar30 = ZEXT216(CONCAT11(cVar8,cVar8));
                auVar30 = pshuflw(auVar30,auVar30,0);
                local_98 = auVar30[0];
                cStack_97 = auVar30[1];
                cStack_96 = auVar30[2];
                cStack_95 = auVar30[3];
                lVar16 = (long)iVar17;
                for (uVar20 = 0; uVar20 != size; uVar20 = uVar20 + 1) {
                  lVar21 = lVar16;
                  for (lVar23 = 0; lVar23 != 0x10; lVar23 = lVar23 + 1) {
                    lVar24 = -0x80;
                    if (-0x80 < lVar21) {
                      lVar24 = lVar21;
                    }
                    lVar26 = lVar21 - (ulong)(uint)open;
                    if ((long)(lVar21 - (ulong)(uint)open) < -0x7f) {
                      lVar26 = -0x80;
                    }
                    h.v[lVar23] = (int8_t)lVar24;
                    e.v[lVar23] = (int8_t)lVar26;
                    lVar21 = lVar21 - size * (uint)gap;
                  }
                  palVar11[uVar20][0] = h.m[0];
                  palVar11[uVar20][1] = h.m[1];
                  ptr[uVar20][0] = e.m[0];
                  ptr[uVar20][1] = e.m[1];
                  lVar16 = lVar16 - (ulong)(uint)gap;
                }
                *ptr_00 = '\0';
                for (uVar20 = 1; s2Len + 1 != uVar20; uVar20 = uVar20 + 1) {
                  iVar12 = -0x80;
                  if (-0x80 < iVar17) {
                    iVar12 = (int8_t)iVar17;
                  }
                  ptr_00[uVar20] = iVar12;
                  iVar17 = iVar17 - gap;
                }
                uVar20 = 0;
                auVar49[4] = local_98;
                auVar49._0_4_ = auVar30._0_4_;
                auVar49[5] = cStack_97;
                auVar49[6] = cStack_96;
                auVar49[7] = cStack_95;
                auVar49[8] = local_98;
                auVar49[9] = cStack_97;
                auVar49[10] = cStack_96;
                auVar49[0xb] = cStack_95;
                auVar49[0xc] = local_98;
                auVar49[0xd] = cStack_97;
                auVar49[0xe] = cStack_96;
                auVar49[0xf] = cStack_95;
                auVar52[4] = local_c8;
                auVar52._0_4_ = auVar29._0_4_;
                auVar52[5] = cStack_c7;
                auVar52[6] = cStack_c6;
                auVar52[7] = cStack_c5;
                auVar52[8] = local_c8;
                auVar52[9] = cStack_c7;
                auVar52[10] = cStack_c6;
                auVar52[0xb] = cStack_c5;
                auVar52[0xc] = local_c8;
                auVar52[0xd] = cStack_c7;
                auVar52[0xe] = cStack_c6;
                auVar52[0xf] = cStack_c5;
                do {
                  ptr_01 = palVar11;
                  if (uVar20 == (uint)s2Len) {
                    alVar39 = ptr_01[(ulong)uVar19 % size];
                    iVar17 = 0;
                    while( true ) {
                      uVar20 = alVar39[0];
                      lVar16 = alVar39[1];
                      if (0xf - (int)(uVar19 / size) <= iVar17) break;
                      alVar39[0] = uVar20 << 8;
                      alVar39[1] = lVar16 << 8 | uVar20 >> 0x38;
                      iVar17 = iVar17 + 1;
                    }
                    auVar47[0] = -(auVar49[0] < local_c8);
                    auVar47[1] = -(auVar49[1] < cStack_c7);
                    auVar47[2] = -(auVar49[2] < cStack_c6);
                    auVar47[3] = -(auVar49[3] < cStack_c5);
                    auVar47[4] = -(auVar49[4] < local_c8);
                    auVar47[5] = -(auVar49[5] < cStack_c7);
                    auVar47[6] = -(auVar49[6] < cStack_c6);
                    auVar47[7] = -(auVar49[7] < cStack_c5);
                    auVar47[8] = -(auVar49[8] < local_c8);
                    auVar47[9] = -(auVar49[9] < cStack_c7);
                    auVar47[10] = -(auVar49[10] < cStack_c6);
                    auVar47[0xb] = -(auVar49[0xb] < cStack_c5);
                    auVar47[0xc] = -(auVar49[0xc] < local_c8);
                    auVar47[0xd] = -(auVar49[0xd] < cStack_c7);
                    auVar47[0xe] = -(auVar49[0xe] < cStack_c6);
                    auVar47[0xf] = -(auVar49[0xf] < cStack_c5);
                    auVar53[0] = -(local_98 < auVar52[0]);
                    auVar53[1] = -(cStack_97 < auVar52[1]);
                    auVar53[2] = -(cStack_96 < auVar52[2]);
                    auVar53[3] = -(cStack_95 < auVar52[3]);
                    auVar53[4] = -(local_98 < auVar52[4]);
                    auVar53[5] = -(cStack_97 < auVar52[5]);
                    auVar53[6] = -(cStack_96 < auVar52[6]);
                    auVar53[7] = -(cStack_95 < auVar52[7]);
                    auVar53[8] = -(local_98 < auVar52[8]);
                    auVar53[9] = -(cStack_97 < auVar52[9]);
                    auVar53[10] = -(cStack_96 < auVar52[10]);
                    auVar53[0xb] = -(cStack_95 < auVar52[0xb]);
                    auVar53[0xc] = -(local_98 < auVar52[0xc]);
                    auVar53[0xd] = -(cStack_97 < auVar52[0xd]);
                    auVar53[0xe] = -(cStack_96 < auVar52[0xe]);
                    auVar53[0xf] = -(cStack_95 < auVar52[0xf]);
                    auVar53 = auVar53 | auVar47;
                    if ((((((((((((((((auVar53 >> 7 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0 &&
                                     (auVar53 >> 0xf & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar53 >> 0x17 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar53 >> 0x1f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar53 >> 0x27 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar53 >> 0x2f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar53 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar53 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar53 >> 0x47 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar53 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar53 >> 0x57 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar53 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar53 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar53 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        (auVar53 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                        -1 < auVar53[0xf]) {
                      cVar8 = alVar39[1]._7_1_;
                    }
                    else {
                      *(byte *)&ppVar10->flag = (byte)ppVar10->flag | 0x40;
                      cVar8 = '\0';
                      iVar13 = 0;
                      uVar19 = 0;
                    }
                    ppVar10->score = (int)cVar8;
                    ppVar10->end_query = uVar19;
                    ppVar10->end_ref = iVar13;
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(local_160);
                    parasail_free(ptr_01);
                    return ppVar10;
                  }
                  uVar18 = ptr_01[(int)size - 1][0];
                  auVar31._0_8_ = uVar18 << 8;
                  auVar31._8_8_ = ptr_01[(int)size - 1][1] << 8 | uVar18 >> 0x38;
                  iVar17 = ppVar2->mapper[(byte)s2[uVar20]];
                  auVar31 = ~_DAT_008a1a20 & ZEXT116((byte)ptr_00[uVar20]) | auVar31;
                  lVar16 = 0;
                  auVar50[4] = local_c8;
                  auVar50._0_4_ = auVar29._0_4_;
                  auVar50[5] = cStack_c7;
                  auVar50[6] = cStack_c6;
                  auVar50[7] = cStack_c5;
                  auVar50[8] = local_c8;
                  auVar50[9] = cStack_c7;
                  auVar50[10] = cStack_c6;
                  auVar50[0xb] = cStack_c5;
                  auVar50[0xc] = local_c8;
                  auVar50[0xd] = cStack_c7;
                  auVar50[0xe] = cStack_c6;
                  auVar50[0xf] = cStack_c5;
                  piVar22 = ptr_00;
                  for (uVar18 = 0; size != uVar18; uVar18 = uVar18 + 1) {
                    auVar32 = paddsb(auVar31,*(undefined1 (*) [16])
                                              ((long)pvVar1 +
                                              lVar16 + (long)(iVar17 * (int)size) * 0x10));
                    auVar30 = *(undefined1 (*) [16])((long)*ptr + lVar16);
                    auVar43[0] = -(auVar30[0] < auVar32[0]);
                    auVar43[1] = -(auVar30[1] < auVar32[1]);
                    auVar43[2] = -(auVar30[2] < auVar32[2]);
                    auVar43[3] = -(auVar30[3] < auVar32[3]);
                    auVar43[4] = -(auVar30[4] < auVar32[4]);
                    auVar43[5] = -(auVar30[5] < auVar32[5]);
                    auVar43[6] = -(auVar30[6] < auVar32[6]);
                    auVar43[7] = -(auVar30[7] < auVar32[7]);
                    auVar43[8] = -(auVar30[8] < auVar32[8]);
                    auVar43[9] = -(auVar30[9] < auVar32[9]);
                    auVar43[10] = -(auVar30[10] < auVar32[10]);
                    auVar43[0xb] = -(auVar30[0xb] < auVar32[0xb]);
                    auVar43[0xc] = -(auVar30[0xc] < auVar32[0xc]);
                    auVar43[0xd] = -(auVar30[0xd] < auVar32[0xd]);
                    auVar43[0xe] = -(auVar30[0xe] < auVar32[0xe]);
                    auVar43[0xf] = -(auVar30[0xf] < auVar32[0xf]);
                    auVar32 = ~auVar43 & auVar30 | auVar32 & auVar43;
                    auVar54[0] = -(auVar50[0] < auVar32[0]);
                    auVar54[1] = -(auVar50[1] < auVar32[1]);
                    auVar54[2] = -(auVar50[2] < auVar32[2]);
                    auVar54[3] = -(auVar50[3] < auVar32[3]);
                    auVar54[4] = -(auVar50[4] < auVar32[4]);
                    auVar54[5] = -(auVar50[5] < auVar32[5]);
                    auVar54[6] = -(auVar50[6] < auVar32[6]);
                    auVar54[7] = -(auVar50[7] < auVar32[7]);
                    auVar54[8] = -(auVar50[8] < auVar32[8]);
                    auVar54[9] = -(auVar50[9] < auVar32[9]);
                    auVar54[10] = -(auVar50[10] < auVar32[10]);
                    auVar54[0xb] = -(auVar50[0xb] < auVar32[0xb]);
                    auVar54[0xc] = -(auVar50[0xc] < auVar32[0xc]);
                    auVar54[0xd] = -(auVar50[0xd] < auVar32[0xd]);
                    auVar54[0xe] = -(auVar50[0xe] < auVar32[0xe]);
                    auVar54[0xf] = -(auVar50[0xf] < auVar32[0xf]);
                    auVar31 = ~auVar54 & auVar50 | auVar32 & auVar54;
                    *(undefined1 (*) [16])((long)*local_160 + lVar16) = auVar31;
                    auVar33[0] = -(auVar31[0] < auVar52[0]);
                    auVar33[1] = -(auVar31[1] < auVar52[1]);
                    auVar33[2] = -(auVar31[2] < auVar52[2]);
                    auVar33[3] = -(auVar31[3] < auVar52[3]);
                    auVar33[4] = -(auVar31[4] < auVar52[4]);
                    auVar33[5] = -(auVar31[5] < auVar52[5]);
                    auVar33[6] = -(auVar31[6] < auVar52[6]);
                    auVar33[7] = -(auVar31[7] < auVar52[7]);
                    auVar33[8] = -(auVar31[8] < auVar52[8]);
                    auVar33[9] = -(auVar31[9] < auVar52[9]);
                    auVar33[10] = -(auVar31[10] < auVar52[10]);
                    auVar33[0xb] = -(auVar31[0xb] < auVar52[0xb]);
                    auVar33[0xc] = -(auVar31[0xc] < auVar52[0xc]);
                    auVar33[0xd] = -(auVar31[0xd] < auVar52[0xd]);
                    auVar33[0xe] = -(auVar31[0xe] < auVar52[0xe]);
                    auVar33[0xf] = -(auVar31[0xf] < auVar52[0xf]);
                    auVar52 = auVar52 & auVar33 | ~auVar33 & auVar31;
                    auVar34[0] = -(auVar31[0] < auVar49[0]);
                    auVar34[1] = -(auVar31[1] < auVar49[1]);
                    auVar34[2] = -(auVar31[2] < auVar49[2]);
                    auVar34[3] = -(auVar31[3] < auVar49[3]);
                    auVar34[4] = -(auVar31[4] < auVar49[4]);
                    auVar34[5] = -(auVar31[5] < auVar49[5]);
                    auVar34[6] = -(auVar31[6] < auVar49[6]);
                    auVar34[7] = -(auVar31[7] < auVar49[7]);
                    auVar34[8] = -(auVar31[8] < auVar49[8]);
                    auVar34[9] = -(auVar31[9] < auVar49[9]);
                    auVar34[10] = -(auVar31[10] < auVar49[10]);
                    auVar34[0xb] = -(auVar31[0xb] < auVar49[0xb]);
                    auVar34[0xc] = -(auVar31[0xc] < auVar49[0xc]);
                    auVar34[0xd] = -(auVar31[0xd] < auVar49[0xd]);
                    auVar34[0xe] = -(auVar31[0xe] < auVar49[0xe]);
                    auVar34[0xf] = -(auVar31[0xf] < auVar49[0xf]);
                    auVar32 = ~auVar34 & auVar49 | auVar31 & auVar34;
                    auVar44[0] = -(auVar30[0] < auVar32[0]);
                    auVar44[1] = -(auVar30[1] < auVar32[1]);
                    auVar44[2] = -(auVar30[2] < auVar32[2]);
                    auVar44[3] = -(auVar30[3] < auVar32[3]);
                    auVar44[4] = -(auVar30[4] < auVar32[4]);
                    auVar44[5] = -(auVar30[5] < auVar32[5]);
                    auVar44[6] = -(auVar30[6] < auVar32[6]);
                    auVar44[7] = -(auVar30[7] < auVar32[7]);
                    auVar44[8] = -(auVar30[8] < auVar32[8]);
                    auVar44[9] = -(auVar30[9] < auVar32[9]);
                    auVar44[10] = -(auVar30[10] < auVar32[10]);
                    auVar44[0xb] = -(auVar30[0xb] < auVar32[0xb]);
                    auVar44[0xc] = -(auVar30[0xc] < auVar32[0xc]);
                    auVar44[0xd] = -(auVar30[0xd] < auVar32[0xd]);
                    auVar44[0xe] = -(auVar30[0xe] < auVar32[0xe]);
                    auVar44[0xf] = -(auVar30[0xf] < auVar32[0xf]);
                    auVar32 = ~auVar44 & auVar32 | auVar30 & auVar44;
                    auVar48[0] = -(auVar50[0] < auVar32[0]);
                    auVar48[1] = -(auVar50[1] < auVar32[1]);
                    auVar48[2] = -(auVar50[2] < auVar32[2]);
                    auVar48[3] = -(auVar50[3] < auVar32[3]);
                    auVar48[4] = -(auVar50[4] < auVar32[4]);
                    auVar48[5] = -(auVar50[5] < auVar32[5]);
                    auVar48[6] = -(auVar50[6] < auVar32[6]);
                    auVar48[7] = -(auVar50[7] < auVar32[7]);
                    auVar48[8] = -(auVar50[8] < auVar32[8]);
                    auVar48[9] = -(auVar50[9] < auVar32[9]);
                    auVar48[10] = -(auVar50[10] < auVar32[10]);
                    auVar48[0xb] = -(auVar50[0xb] < auVar32[0xb]);
                    auVar48[0xc] = -(auVar50[0xc] < auVar32[0xc]);
                    auVar48[0xd] = -(auVar50[0xd] < auVar32[0xd]);
                    auVar48[0xe] = -(auVar50[0xe] < auVar32[0xe]);
                    auVar48[0xf] = -(auVar50[0xf] < auVar32[0xf]);
                    auVar49 = ~auVar48 & auVar32 | auVar50 & auVar48;
                    alVar46[0] = uVar18 & 0xffffffff;
                    alVar46[1] = size;
                    arr_store_si128(((ppVar10->field_4).rowcols)->score_row,alVar46,(int32_t)uVar20,
                                    s2Len,(int32_t)piVar22,in_stack_fffffffffffffe98);
                    auVar6._4_4_ = uVar27;
                    auVar6._0_4_ = uVar27;
                    auVar6._8_4_ = uVar27;
                    auVar6._12_4_ = uVar27;
                    auVar32 = psubsb(auVar31,auVar6);
                    auVar4._4_4_ = uVar28;
                    auVar4._0_4_ = uVar28;
                    auVar4._8_4_ = uVar28;
                    auVar4._12_4_ = uVar28;
                    auVar30 = psubsb(auVar30,auVar4);
                    auVar35[0] = -(auVar32[0] < auVar30[0]);
                    auVar35[1] = -(auVar32[1] < auVar30[1]);
                    auVar35[2] = -(auVar32[2] < auVar30[2]);
                    auVar35[3] = -(auVar32[3] < auVar30[3]);
                    auVar35[4] = -(auVar32[4] < auVar30[4]);
                    auVar35[5] = -(auVar32[5] < auVar30[5]);
                    auVar35[6] = -(auVar32[6] < auVar30[6]);
                    auVar35[7] = -(auVar32[7] < auVar30[7]);
                    auVar35[8] = -(auVar32[8] < auVar30[8]);
                    auVar35[9] = -(auVar32[9] < auVar30[9]);
                    auVar35[10] = -(auVar32[10] < auVar30[10]);
                    auVar35[0xb] = -(auVar32[0xb] < auVar30[0xb]);
                    auVar35[0xc] = -(auVar32[0xc] < auVar30[0xc]);
                    auVar35[0xd] = -(auVar32[0xd] < auVar30[0xd]);
                    auVar35[0xe] = -(auVar32[0xe] < auVar30[0xe]);
                    auVar35[0xf] = -(auVar32[0xf] < auVar30[0xf]);
                    *(undefined1 (*) [16])((long)*ptr + lVar16) =
                         ~auVar35 & auVar32 | auVar30 & auVar35;
                    auVar30 = psubsb(auVar50,auVar4);
                    auVar36[0] = -(auVar32[0] < auVar30[0]);
                    auVar36[1] = -(auVar32[1] < auVar30[1]);
                    auVar36[2] = -(auVar32[2] < auVar30[2]);
                    auVar36[3] = -(auVar32[3] < auVar30[3]);
                    auVar36[4] = -(auVar32[4] < auVar30[4]);
                    auVar36[5] = -(auVar32[5] < auVar30[5]);
                    auVar36[6] = -(auVar32[6] < auVar30[6]);
                    auVar36[7] = -(auVar32[7] < auVar30[7]);
                    auVar36[8] = -(auVar32[8] < auVar30[8]);
                    auVar36[9] = -(auVar32[9] < auVar30[9]);
                    auVar36[10] = -(auVar32[10] < auVar30[10]);
                    auVar36[0xb] = -(auVar32[0xb] < auVar30[0xb]);
                    auVar36[0xc] = -(auVar32[0xc] < auVar30[0xc]);
                    auVar36[0xd] = -(auVar32[0xd] < auVar30[0xd]);
                    auVar36[0xe] = -(auVar32[0xe] < auVar30[0xe]);
                    auVar36[0xf] = -(auVar32[0xf] < auVar30[0xf]);
                    auVar50 = auVar30 & auVar36 | ~auVar36 & auVar32;
                    auVar31 = *(undefined1 (*) [16])((long)*ptr_01 + lVar16);
                    lVar16 = lVar16 + 0x10;
                  }
                  for (iVar17 = 0; iVar17 != 0x10; iVar17 = iVar17 + 1) {
                    uVar9 = ptr_00[uVar20 + 1] - open;
                    if ((int)uVar9 < -0x7f) {
                      uVar9 = 0xffffff80;
                    }
                    auVar51._0_8_ = auVar50._0_8_ << 8;
                    auVar51._8_8_ = auVar50._8_8_ << 8 | auVar50._0_8_ >> 0x38;
                    auVar50 = auVar51 | ~_DAT_008a1a20 & ZEXT416(uVar9);
                    uVar18 = 0;
                    palVar11 = local_160;
                    while (size != uVar18) {
                      alVar46 = *palVar11;
                      auVar45[0] = -(auVar50[0] < (char)alVar46[0]);
                      auVar45[1] = -(auVar50[1] < alVar46[0]._1_1_);
                      auVar45[2] = -(auVar50[2] < alVar46[0]._2_1_);
                      auVar45[3] = -(auVar50[3] < alVar46[0]._3_1_);
                      auVar45[4] = -(auVar50[4] < alVar46[0]._4_1_);
                      auVar45[5] = -(auVar50[5] < alVar46[0]._5_1_);
                      auVar45[6] = -(auVar50[6] < alVar46[0]._6_1_);
                      auVar45[7] = -(auVar50[7] < alVar46[0]._7_1_);
                      auVar45[8] = -(auVar50[8] < (char)alVar46[1]);
                      auVar45[9] = -(auVar50[9] < alVar46[1]._1_1_);
                      auVar45[10] = -(auVar50[10] < alVar46[1]._2_1_);
                      auVar45[0xb] = -(auVar50[0xb] < alVar46[1]._3_1_);
                      auVar45[0xc] = -(auVar50[0xc] < alVar46[1]._4_1_);
                      auVar45[0xd] = -(auVar50[0xd] < alVar46[1]._5_1_);
                      auVar45[0xe] = -(auVar50[0xe] < alVar46[1]._6_1_);
                      auVar45[0xf] = -(auVar50[0xf] < alVar46[1]._7_1_);
                      alVar46 = (__m128i)(~auVar45 & auVar50 | (undefined1  [16])alVar46 & auVar45);
                      *palVar11 = alVar46;
                      auVar55[0] = -((char)alVar46[0] < auVar49[0]);
                      auVar55[1] = -(alVar46[0]._1_1_ < auVar49[1]);
                      auVar55[2] = -(alVar46[0]._2_1_ < auVar49[2]);
                      auVar55[3] = -(alVar46[0]._3_1_ < auVar49[3]);
                      auVar55[4] = -(alVar46[0]._4_1_ < auVar49[4]);
                      auVar55[5] = -(alVar46[0]._5_1_ < auVar49[5]);
                      auVar55[6] = -(alVar46[0]._6_1_ < auVar49[6]);
                      auVar55[7] = -(alVar46[0]._7_1_ < auVar49[7]);
                      auVar55[8] = -((char)alVar46[1] < auVar49[8]);
                      auVar55[9] = -(alVar46[1]._1_1_ < auVar49[9]);
                      auVar55[10] = -(alVar46[1]._2_1_ < auVar49[10]);
                      auVar55[0xb] = -(alVar46[1]._3_1_ < auVar49[0xb]);
                      auVar55[0xc] = -(alVar46[1]._4_1_ < auVar49[0xc]);
                      auVar55[0xd] = -(alVar46[1]._5_1_ < auVar49[0xd]);
                      auVar55[0xe] = -(alVar46[1]._6_1_ < auVar49[0xe]);
                      auVar55[0xf] = -(alVar46[1]._7_1_ < auVar49[0xf]);
                      auVar49 = ~auVar55 & auVar49 | (undefined1  [16])alVar46 & auVar55;
                      auVar37[0] = -((char)alVar46[0] < auVar52[0]);
                      auVar37[1] = -(alVar46[0]._1_1_ < auVar52[1]);
                      auVar37[2] = -(alVar46[0]._2_1_ < auVar52[2]);
                      auVar37[3] = -(alVar46[0]._3_1_ < auVar52[3]);
                      auVar37[4] = -(alVar46[0]._4_1_ < auVar52[4]);
                      auVar37[5] = -(alVar46[0]._5_1_ < auVar52[5]);
                      auVar37[6] = -(alVar46[0]._6_1_ < auVar52[6]);
                      auVar37[7] = -(alVar46[0]._7_1_ < auVar52[7]);
                      auVar37[8] = -((char)alVar46[1] < auVar52[8]);
                      auVar37[9] = -(alVar46[1]._1_1_ < auVar52[9]);
                      auVar37[10] = -(alVar46[1]._2_1_ < auVar52[10]);
                      auVar37[0xb] = -(alVar46[1]._3_1_ < auVar52[0xb]);
                      auVar37[0xc] = -(alVar46[1]._4_1_ < auVar52[0xc]);
                      auVar37[0xd] = -(alVar46[1]._5_1_ < auVar52[0xd]);
                      auVar37[0xe] = -(alVar46[1]._6_1_ < auVar52[0xe]);
                      auVar37[0xf] = -(alVar46[1]._7_1_ < auVar52[0xf]);
                      auVar52 = auVar52 & auVar37 | ~auVar37 & (undefined1  [16])alVar46;
                      vH[0] = uVar18 & 0xffffffff;
                      vH[1] = size;
                      arr_store_si128(((ppVar10->field_4).rowcols)->score_row,vH,(int32_t)uVar20,
                                      s2Len,(int32_t)piVar22,in_stack_fffffffffffffe98);
                      auVar7._4_4_ = uVar27;
                      auVar7._0_4_ = uVar27;
                      auVar7._8_4_ = uVar27;
                      auVar7._12_4_ = uVar27;
                      auVar30 = psubsb((undefined1  [16])alVar46,auVar7);
                      auVar5._4_4_ = uVar28;
                      auVar5._0_4_ = uVar28;
                      auVar5._8_4_ = uVar28;
                      auVar5._12_4_ = uVar28;
                      auVar50 = psubsb(auVar50,auVar5);
                      auVar38[0] = -(auVar30[0] < auVar50[0]);
                      auVar38[1] = -(auVar30[1] < auVar50[1]);
                      auVar38[2] = -(auVar30[2] < auVar50[2]);
                      auVar38[3] = -(auVar30[3] < auVar50[3]);
                      auVar38[4] = -(auVar30[4] < auVar50[4]);
                      auVar38[5] = -(auVar30[5] < auVar50[5]);
                      auVar38[6] = -(auVar30[6] < auVar50[6]);
                      auVar38[7] = -(auVar30[7] < auVar50[7]);
                      auVar38[8] = -(auVar30[8] < auVar50[8]);
                      auVar38[9] = -(auVar30[9] < auVar50[9]);
                      auVar38[10] = -(auVar30[10] < auVar50[10]);
                      auVar38[0xb] = -(auVar30[0xb] < auVar50[0xb]);
                      auVar38[0xc] = -(auVar30[0xc] < auVar50[0xc]);
                      auVar38[0xd] = -(auVar30[0xd] < auVar50[0xd]);
                      auVar38[0xe] = -(auVar30[0xe] < auVar50[0xe]);
                      bVar3 = auVar30[0xf] < auVar50[0xf];
                      auVar38[0xf] = -bVar3;
                      uVar18 = uVar18 + 1;
                      palVar11 = palVar11 + 1;
                      if ((((((((((((((((auVar38 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar38 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar38 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar38 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar38 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar38 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar38 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar38 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                (auVar38 >> 0x47 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
                               && (auVar38 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0
                               ) && (auVar38 >> 0x57 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                             (auVar38 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                            (auVar38 >> 0x67 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar38 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar38 >> 0x77 & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          !bVar3) goto LAB_0056827e;
                    }
                  }
LAB_0056827e:
                  uVar20 = uVar20 + 1;
                  palVar11 = local_160;
                  local_160 = ptr_01;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar14 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_table_striped_profile_sse2_128_8",pcVar14);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int8_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int8_t NEG_LIMIT = 0;
    int8_t POS_LIMIT = 0;
    int8_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile8.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 16; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile8.score;
    vGapO = _mm_set1_epi8(open);
    vGapE = _mm_set1_epi8(gap);
    NEG_LIMIT = (-open < matrix->min ? INT8_MIN + open : INT8_MIN - matrix->min) + 1;
    POS_LIMIT = INT8_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi8(NEG_LIMIT);
    vPosLimit = _mm_set1_epi8(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_8 | PARASAIL_FLAG_LANES_16;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int8_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_8_t h;
            __m128i_8_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT8_MIN ? INT8_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT8_MIN ? INT8_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 1);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi8_rpl(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_adds_epi8(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi8_rpl(vH, vE);
            vH = _mm_max_epi8_rpl(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi8_rpl(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_subs_epi8(vH, vGapO);
            vE = _mm_subs_epi8(vE, vGapE);
            vE = _mm_max_epi8_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_subs_epi8(vF, vGapE);
            vF = _mm_max_epi8_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int8_t tmp2 = tmp < INT8_MIN ? INT8_MIN : tmp;
            vF = _mm_slli_si128(vF, 1);
            vF = _mm_insert_epi8_rpl(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi8_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi8_rpl(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi8_rpl(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_subs_epi8(vH, vGapO);
                vF = _mm_subs_epi8(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi8(vF, vH))) goto end;
                /*vF = _mm_max_epi8_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 1);
            }
            result->rowcols->score_row[j] = (int8_t) _mm_extract_epi8_rpl (vH, 15);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 1);
        }
        score = (int8_t) _mm_extract_epi8_rpl (vH, 15);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi8(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi8(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}